

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditImageCompareTests.cpp
# Opt level: O0

IterateResult __thiscall dit::FuzzyComparisonMetricCase::iterate(FuzzyComparisonMetricCase *this)

{
  bool bVar1;
  int width;
  int height;
  int depth;
  Archive *pAVar2;
  char *pcVar3;
  deUint64 dVar4;
  TestLog *pTVar5;
  allocator<char> local_889;
  undefined1 local_888 [6];
  bool isOk;
  allocator<char> local_861;
  string local_860;
  allocator<char> local_839;
  string local_838;
  LogNumber<long> local_818;
  allocator<char> local_7a1;
  string local_7a0;
  allocator<char> local_779;
  string local_778;
  allocator<char> local_751;
  string local_750;
  LogNumber<float> local_730;
  allocator<char> local_6c1;
  string local_6c0;
  allocator<char> local_699;
  string local_698;
  allocator<char> local_671;
  string local_670;
  LogNumber<float> local_650;
  allocator<char> local_5e1;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  allocator<char> local_591;
  string local_590;
  LogNumber<float> local_570;
  ConstPixelBufferAccess local_508;
  allocator<char> local_4d9;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  LogImage local_490;
  ConstPixelBufferAccess local_400;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  LogImage local_388;
  ConstPixelBufferAccess local_2f8;
  allocator<char> local_2c9;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  LogImage local_280;
  PixelBufferAccess local_1f0;
  ConstPixelBufferAccess local_1c8;
  ConstPixelBufferAccess local_1a0;
  deUint64 local_178;
  deUint64 startTime;
  FilePath local_168;
  FilePath local_148;
  FilePath local_128;
  FilePath local_108;
  FilePath local_e8;
  FilePath local_c8;
  long local_a8;
  deUint64 compareTime;
  float result;
  FuzzyCompareParams params;
  TextureLevel errorMask;
  undefined1 local_60 [8];
  TextureLevel cmpImg;
  TextureLevel refImg;
  FuzzyComparisonMetricCase *this_local;
  
  tcu::TextureLevel::TextureLevel((TextureLevel *)&cmpImg.m_data.m_cap);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_60);
  tcu::TextureLevel::TextureLevel((TextureLevel *)&result);
  tcu::FuzzyCompareParams::FuzzyCompareParams((FuzzyCompareParams *)((long)&compareTime + 4),8);
  compareTime._0_4_ = 0.0;
  local_a8 = 0;
  compareTime._4_4_ = 0;
  pAVar2 = tcu::TestContext::getArchive((this->super_TestCase).super_TestNode.m_testCtx);
  de::FilePath::FilePath(&local_e8,BASE_DIR);
  de::FilePath::FilePath(&local_108,&this->m_refImg);
  de::FilePath::join(&local_c8,&local_e8,&local_108);
  pcVar3 = de::FilePath::getPath(&local_c8);
  tcu::ImageIO::loadImage((TextureLevel *)&cmpImg.m_data.m_cap,pAVar2,pcVar3);
  de::FilePath::~FilePath(&local_c8);
  de::FilePath::~FilePath(&local_108);
  de::FilePath::~FilePath(&local_e8);
  pAVar2 = tcu::TestContext::getArchive((this->super_TestCase).super_TestNode.m_testCtx);
  de::FilePath::FilePath(&local_148,BASE_DIR);
  de::FilePath::FilePath(&local_168,&this->m_cmpImg);
  de::FilePath::join(&local_128,&local_148,&local_168);
  pcVar3 = de::FilePath::getPath(&local_128);
  tcu::ImageIO::loadImage((TextureLevel *)local_60,pAVar2,pcVar3);
  de::FilePath::~FilePath(&local_128);
  de::FilePath::~FilePath(&local_168);
  de::FilePath::~FilePath(&local_148);
  startTime = (deUint64)tcu::TextureLevel::getFormat((TextureLevel *)&cmpImg.m_data.m_cap);
  width = tcu::TextureLevel::getWidth((TextureLevel *)&cmpImg.m_data.m_cap);
  height = tcu::TextureLevel::getHeight((TextureLevel *)&cmpImg.m_data.m_cap);
  depth = tcu::TextureLevel::getDepth((TextureLevel *)&cmpImg.m_data.m_cap);
  tcu::TextureLevel::setStorage
            ((TextureLevel *)&result,(TextureFormat *)&startTime,width,height,depth);
  local_178 = deGetMicroseconds();
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_1a0,(TextureLevel *)&cmpImg.m_data.m_cap);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_1c8,(TextureLevel *)local_60);
  tcu::PixelBufferAccess::PixelBufferAccess(&local_1f0,(TextureLevel *)&result);
  compareTime._0_4_ =
       tcu::fuzzyCompare((FuzzyCompareParams *)((long)&compareTime + 4),&local_1a0,&local_1c8,
                         &local_1f0);
  dVar4 = deGetMicroseconds();
  local_a8 = dVar4 - local_178;
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"RefImage",&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,"Reference Image",&local_2c9);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_2f8,(TextureLevel *)&cmpImg.m_data.m_cap);
  tcu::LogImage::LogImage
            (&local_280,&local_2a0,&local_2c8,&local_2f8,QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"CmpImage",&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"Compare Image",&local_3d1);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_400,(TextureLevel *)local_60);
  tcu::LogImage::LogImage
            (&local_388,&local_3a8,&local_3d0,&local_400,QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,"ErrorMask",&local_4b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"Error Mask",&local_4d9);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_508,(TextureLevel *)&result);
  tcu::LogImage::LogImage
            (&local_490,&local_4b0,&local_4d8,&local_508,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(pTVar5,&local_490);
  tcu::LogImage::~LogImage(&local_490);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  tcu::LogImage::~LogImage(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  tcu::LogImage::~LogImage(&local_280);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"Result",&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"Result metric",&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e0,"",&local_5e1);
  tcu::LogNumber<float>::LogNumber
            (&local_570,&local_590,&local_5b8,&local_5e0,QP_KEY_TAG_NONE,(float)compareTime);
  pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_570);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_670,"MinBound",&local_671);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_698,"Minimum bound",&local_699);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c0,"",&local_6c1);
  tcu::LogNumber<float>::LogNumber
            (&local_650,&local_670,&local_698,&local_6c0,QP_KEY_TAG_NONE,this->m_minBound);
  pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_650);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_750,"MaxBound",&local_751);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_778,"Maximum bound",&local_779);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a0,"",&local_7a1);
  tcu::LogNumber<float>::LogNumber
            (&local_730,&local_750,&local_778,&local_7a0,QP_KEY_TAG_NONE,this->m_maxBound);
  pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_730);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_838,"CompareTime",&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_860,"Comparison time",&local_861);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_888,"us",&local_889);
  tcu::LogNumber<long>::LogNumber
            (&local_818,&local_838,&local_860,(string *)local_888,QP_KEY_TAG_TIME,local_a8);
  tcu::TestLog::operator<<(pTVar5,&local_818);
  tcu::LogNumber<long>::~LogNumber(&local_818);
  std::__cxx11::string::~string((string *)local_888);
  std::allocator<char>::~allocator(&local_889);
  std::__cxx11::string::~string((string *)&local_860);
  std::allocator<char>::~allocator(&local_861);
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator(&local_839);
  tcu::LogNumber<float>::~LogNumber(&local_730);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::allocator<char>::~allocator(&local_7a1);
  std::__cxx11::string::~string((string *)&local_778);
  std::allocator<char>::~allocator(&local_779);
  std::__cxx11::string::~string((string *)&local_750);
  std::allocator<char>::~allocator(&local_751);
  tcu::LogNumber<float>::~LogNumber(&local_650);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator(&local_6c1);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator(&local_699);
  std::__cxx11::string::~string((string *)&local_670);
  std::allocator<char>::~allocator(&local_671);
  tcu::LogNumber<float>::~LogNumber(&local_570);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  bVar1 = de::inRange<float>((float)compareTime,this->m_minBound,this->m_maxBound);
  pcVar3 = "Metric out of bounds";
  if (bVar1) {
    pcVar3 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(byte)~bVar1 & QP_TEST_RESULT_FAIL,
             pcVar3);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&result);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_60);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&cmpImg.m_data.m_cap);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		tcu::TextureLevel		refImg;
		tcu::TextureLevel		cmpImg;
		tcu::TextureLevel		errorMask;
		tcu::FuzzyCompareParams	params;
		float					result		= 0.0f;
		deUint64				compareTime	= 0;

		params.maxSampleSkip = 0;

		tcu::ImageIO::loadImage(refImg, m_testCtx.getArchive(), de::FilePath::join(BASE_DIR, m_refImg).getPath());
		tcu::ImageIO::loadImage(cmpImg, m_testCtx.getArchive(), de::FilePath::join(BASE_DIR, m_cmpImg).getPath());

		errorMask.setStorage(refImg.getFormat(), refImg.getWidth(), refImg.getHeight(), refImg.getDepth());

		{
			const deUint64 startTime = deGetMicroseconds();
			result = tcu::fuzzyCompare(params, refImg, cmpImg, errorMask);
			compareTime = deGetMicroseconds()-startTime;
		}

		m_testCtx.getLog() << TestLog::Image("RefImage",	"Reference Image",	refImg)
						   << TestLog::Image("CmpImage",	"Compare Image",	cmpImg)
						   << TestLog::Image("ErrorMask",	"Error Mask",		errorMask);

		m_testCtx.getLog() << TestLog::Float("Result", "Result metric", "", QP_KEY_TAG_NONE, result)
						   << TestLog::Float("MinBound", "Minimum bound", "", QP_KEY_TAG_NONE, m_minBound)
						   << TestLog::Float("MaxBound", "Maximum bound", "", QP_KEY_TAG_NONE, m_maxBound)
						   << TestLog::Integer("CompareTime", "Comparison time", "us", QP_KEY_TAG_TIME, compareTime);

		{
			const bool isOk = de::inRange(result, m_minBound, m_maxBound);
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Metric out of bounds");
		}

		return STOP;
	}